

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

VecZNode * new_VecZNode(VecVecZNode *paths,int n,int parent)

{
  uint uVar1;
  ZNode *pZVar2;
  VecZNode *local_28;
  VecZNode *pv;
  int i;
  int parent_local;
  int n_local;
  VecVecZNode *paths_local;
  
  if (paths->n == 0) {
    local_28 = &path1;
  }
  else {
    local_28 = (VecZNode *)malloc(0x28);
  }
  local_28->n = 0;
  local_28->v = (ZNode **)0x0;
  if (-1 < parent) {
    for (pv._4_4_ = 0; pv._4_4_ < n; pv._4_4_ = pv._4_4_ + 1) {
      if (local_28->v == (ZNode **)0x0) {
        pZVar2 = paths->v[parent]->v[pv._4_4_];
        local_28->v = local_28->e;
        uVar1 = local_28->n;
        local_28->n = uVar1 + 1;
        local_28->e[uVar1] = pZVar2;
      }
      else if (local_28->v == local_28->e) {
        if (local_28->n < 3) {
          pZVar2 = paths->v[parent]->v[pv._4_4_];
          uVar1 = local_28->n;
          local_28->n = uVar1 + 1;
          local_28->v[uVar1] = pZVar2;
        }
        else {
LAB_0012ff84:
          vec_add_internal(local_28,paths->v[parent]->v[pv._4_4_]);
        }
      }
      else {
        if ((local_28->n & 7) == 0) goto LAB_0012ff84;
        pZVar2 = paths->v[parent]->v[pv._4_4_];
        uVar1 = local_28->n;
        local_28->n = uVar1 + 1;
        local_28->v[uVar1] = pZVar2;
      }
    }
  }
  return local_28;
}

Assistant:

static VecZNode *new_VecZNode(VecVecZNode *paths, int n, int parent) {
  int i;
  VecZNode *pv;

  if (!paths->n)
    pv = &path1;
  else
    pv = MALLOC(sizeof *pv);
  vec_clear(pv);
  if (parent >= 0)
    for (i = 0; i < n; i++) vec_add(pv, paths->v[parent]->v[i]);
  return pv;
}